

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::addUniqueAttribute
          (GLShaderProgram *this,ShaderSpecAttribute *newAttribute)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pGVar2;
  size_t __n;
  pointer pcVar3;
  int iVar4;
  GLShaderAttribute *a;
  pointer pGVar5;
  GLShaderAttribute local_60;
  
  pGVar5 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = (newAttribute->name)._M_string_length;
  while( true ) {
    if (pGVar5 == pGVar2) {
      paVar1 = &local_60.name.field_2;
      pcVar3 = (newAttribute->name)._M_dataplus._M_p;
      local_60.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar3,pcVar3 + __n);
      local_60.type = newAttribute->type;
      local_60.arrayCount = newAttribute->arrayCount;
      local_60.dataSize = -1;
      local_60.location = 0x309;
      local_60.VBOLoc = 0x309;
      std::
      vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
      ::emplace_back<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>
                (&this->attributes,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_60.name._M_dataplus._M_p);
      }
      return;
    }
    if (((pGVar5->name)._M_string_length == __n) &&
       (((__n == 0 ||
         (iVar4 = bcmp((pGVar5->name)._M_dataplus._M_p,(newAttribute->name)._M_dataplus._M_p,__n),
         iVar4 == 0)) && (pGVar5->type == newAttribute->type)))) break;
    pGVar5 = pGVar5 + 1;
  }
  return;
}

Assistant:

void GLShaderProgram::addUniqueAttribute(ShaderSpecAttribute newAttribute) {
  for (GLShaderAttribute& a : attributes) {
    if (a.name == newAttribute.name && a.type == newAttribute.type) {
      return;
    }
  }
  attributes.push_back(GLShaderAttribute{newAttribute.name, newAttribute.type, newAttribute.arrayCount, -1, 777, 777});
}